

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDFacePtr ON_SubDFace::FromVertices(ON_SubDVertex **vertex_list,size_t vertex_count)

{
  ushort uVar1;
  ON_SubDVertex *vertex1;
  ON_SubDFace *f;
  uint uVar2;
  uint uVar3;
  ON_SubDEdgePtr OVar4;
  undefined8 *memblock;
  ulong uVar5;
  ulong uVar6;
  ON_SubDEdgePtr *pOVar7;
  uint uVar8;
  long lVar9;
  ON_SubDVertex *pOVar10;
  ON_SubDEdge *this;
  ON_SubDFacePtr OVar11;
  ON_SubDFacePtr *pOVar12;
  uint uVar13;
  uint uVar14;
  ON_SubDFace *this_00;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ON_SubDFace *candiates4 [4];
  undefined8 local_58 [5];
  
  if (vertex_list == (ON_SubDVertex **)0x0 || vertex_count - 0xfff1 < 0xffffffffffff0012) {
    return (ON_SubDFacePtr)0;
  }
  this_00 = (ON_SubDFace *)0x0;
  uVar14 = 0;
  memblock = (undefined8 *)0x0;
  pOVar10 = *vertex_list;
  uVar3 = 0;
  do {
    uVar13 = (uint)vertex_count;
    if (uVar3 == uVar13) break;
    uVar8 = uVar3 + 1;
    uVar2 = uVar8;
    if (uVar8 == uVar13) {
      uVar2 = 0;
    }
    vertex1 = vertex_list[uVar2];
    OVar4 = ON_SubDEdge::FromVertices(pOVar10,vertex1);
    this = (ON_SubDEdge *)(OVar4.m_ptr & 0xfffffffffffffff8);
    if ((this == (ON_SubDEdge *)0x0) || (uVar1 = this->m_face_count, uVar1 == 0)) {
LAB_005d6bf7:
      uVar14 = 0;
    }
    else if (uVar3 == 0) {
      memblock = local_58;
      if (4 < uVar1) {
        memblock = (undefined8 *)onmalloc((ulong)uVar1 << 3);
      }
      uVar1 = this->m_face_count;
      if ((ulong)uVar1 != 0) {
        lVar9 = -0x10;
        uVar6 = 0;
        do {
          if (uVar6 < 2) {
            pOVar12 = this->m_face2 + uVar6;
          }
          else {
            pOVar12 = (ON_SubDFacePtr *)((long)&this->m_facex->m_ptr + lVar9);
          }
          uVar15 = pOVar12->m_ptr & 0xfffffffffffffff8;
          if ((uVar15 != 0) && (*(ushort *)(uVar15 + 0x9c) == vertex_count)) {
            uVar5 = (ulong)uVar14;
            uVar14 = uVar14 + 1;
            memblock[uVar5] = uVar15;
          }
          uVar6 = uVar6 + 1;
          lVar9 = lVar9 + 8;
        } while (uVar1 != uVar6);
      }
    }
    else {
      if (uVar14 == 0) goto LAB_005d6bf7;
      uVar6 = (ulong)uVar14;
      uVar15 = 0;
      uVar14 = 0;
      do {
        f = (ON_SubDFace *)memblock[uVar15];
        uVar3 = ON_SubDEdge::FaceArrayIndex(this,f);
        if (uVar3 != 0xffffffff) {
          uVar5 = (ulong)uVar14;
          uVar14 = uVar14 + 1;
          memblock[uVar5] = f;
        }
        uVar15 = uVar15 + 1;
      } while (uVar6 != uVar15);
    }
    if (uVar14 == 0) {
LAB_005d6c18:
      bVar17 = false;
    }
    else {
      if (uVar14 == 1) {
        this_00 = (ON_SubDFace *)*memblock;
        goto LAB_005d6c18;
      }
      bVar17 = true;
    }
    pOVar10 = vertex1;
    uVar3 = uVar8;
  } while (bVar17);
  if (memblock != local_58 && memblock != (undefined8 *)0x0) {
    onfree(memblock);
  }
  if (this_00 == (ON_SubDFace *)0x0) {
    return (ON_SubDFacePtr)0;
  }
  uVar3 = VertexIndex(this_00,*vertex_list);
  if (uVar13 <= uVar3) {
    return (ON_SubDFacePtr)0;
  }
  uVar14 = 0;
  if (uVar3 + 1 != uVar13) {
    uVar14 = uVar3 + 1;
  }
  if (uVar14 < 4) {
    pOVar7 = this_00->m_edge4 + uVar14;
LAB_005d6d6d:
    uVar6 = pOVar7->m_ptr;
  }
  else {
    if (uVar14 < this_00->m_edge_count) {
      pOVar7 = this_00->m_edgex + (long)(int)uVar14 + -4;
      goto LAB_005d6d6d;
    }
    uVar6 = 0;
  }
  OVar11.m_ptr = (ON__UINT_PTR)vertex_list[1];
  if ((uVar6 & 0xfffffffffffffff8) == 0) {
    pOVar10 = (ON_SubDVertex *)0x0;
  }
  else {
    pOVar10 = *(ON_SubDVertex **)
               ((uVar6 & 0xfffffffffffffff8) + 0x80 + (ulong)((uint)uVar6 & 1) * 8);
  }
  bVar17 = (ON_SubDVertex *)OVar11.m_ptr == pOVar10;
  if (bVar17) {
    bVar16 = 2 < vertex_count;
    if (bVar16) {
      uVar6 = 3;
      if (3 < uVar13) {
        uVar6 = vertex_count & 0xffffffff;
      }
      uVar3 = uVar3 + 2;
      uVar15 = 3;
      do {
        uVar5 = (ulong)uVar3 % (vertex_count & 0xffffffff);
        if ((uint)uVar5 < 4) {
          pOVar7 = this_00->m_edge4 + uVar5;
LAB_005d6eb6:
          uVar5 = pOVar7->m_ptr;
        }
        else {
          if ((uint)uVar5 < (uint)this_00->m_edge_count) {
            pOVar7 = this_00->m_edgex + (uVar5 - 4);
            goto LAB_005d6eb6;
          }
          uVar5 = 0;
        }
        OVar11.m_ptr = (ON__UINT_PTR)vertex_list[uVar15 - 1];
        if ((uVar5 & 0xfffffffffffffff8) == 0) {
          pOVar10 = (ON_SubDVertex *)0x0;
        }
        else {
          pOVar10 = *(ON_SubDVertex **)
                     ((uVar5 & 0xfffffffffffffff8) + 0x80 + (ulong)((uint)uVar5 & 1) * 8);
        }
        if ((ON_SubDVertex *)OVar11.m_ptr != pOVar10) goto LAB_005d6efc;
        bVar16 = uVar15 < vertex_count;
        uVar3 = uVar3 + 1;
        bVar18 = uVar15 != uVar6;
        uVar15 = uVar15 + 1;
      } while (bVar18);
    }
  }
  else {
    bVar16 = 1 < vertex_count;
    if (bVar16) {
      uVar6 = 2;
      if (2 < uVar13) {
        uVar6 = vertex_count & 0xffffffff;
      }
      uVar3 = uVar3 + uVar13;
      uVar15 = 2;
      do {
        uVar3 = uVar3 - 1;
        uVar5 = (ulong)uVar3 % (vertex_count & 0xffffffff);
        if ((uint)uVar5 < 4) {
          pOVar7 = this_00->m_edge4 + uVar5;
LAB_005d6e06:
          uVar5 = pOVar7->m_ptr;
        }
        else {
          if ((uint)uVar5 < (uint)this_00->m_edge_count) {
            pOVar7 = this_00->m_edgex + (uVar5 - 4);
            goto LAB_005d6e06;
          }
          uVar5 = 0;
        }
        OVar11.m_ptr = (ON__UINT_PTR)vertex_list[uVar15 - 1];
        if ((uVar5 & 0xfffffffffffffff8) == 0) {
          pOVar10 = (ON_SubDVertex *)0x0;
        }
        else {
          pOVar10 = *(ON_SubDVertex **)
                     ((uVar5 & 0xfffffffffffffff8) + 0x80 + (ulong)((uint)uVar5 & 1) * 8);
        }
        if ((ON_SubDVertex *)OVar11.m_ptr != pOVar10) goto LAB_005d6efc;
        bVar16 = uVar15 < vertex_count;
        bVar18 = uVar15 != uVar6;
        uVar15 = uVar15 + 1;
      } while (bVar18);
    }
  }
LAB_005d6f06:
  if (!bVar16) {
    OVar11.m_ptr = (ulong)!bVar17 | (ulong)this_00;
  }
  return (ON_SubDFacePtr)OVar11.m_ptr;
LAB_005d6efc:
  OVar11 = (ON_SubDFacePtr)0;
  goto LAB_005d6f06;
}

Assistant:

const ON_SubDFacePtr ON_SubDFace::FromVertices(const ON_SubDVertex* const* vertex_list, size_t vertex_count)
{
  if (nullptr == vertex_list || vertex_count < 3 || vertex_count > ON_SubDFace::MaximumEdgeCount)
    return ON_SubDFacePtr::Null;

  const ON_SubDFace* candiates4[4];
  const ON_SubDFace** candidates = nullptr;
  unsigned candidate_count = 0;
  const ON_SubDFace* f = nullptr;

  const unsigned unsigned_vertex_count = (unsigned)vertex_count;
  if (unsigned_vertex_count < 3)
    return ON_SubDFacePtr::Null;
  const ON_SubDVertex* v[2] = { nullptr,vertex_list[0] };
  for (unsigned fei = 0; fei < unsigned_vertex_count; ++fei)
  {
    v[0] = v[1];
    v[1] = vertex_list[(fei + 1) % unsigned_vertex_count];
    const ON_SubDEdge* e = ON_SubDEdge::FromVertices(v[0], v[1]).Edge();
    if (nullptr == e || e->m_face_count <= 0)
      candidate_count = 0;
    else if (0 == fei)
    {
      candidates = (e->m_face_count <= 4) ? candiates4 : ((const ON_SubDFace**)onmalloc(e->m_face_count * sizeof(candidates[0])));
      for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
      {
        const ON_SubDFace* ef = e->Face(efi);
        if (nullptr != ef && unsigned_vertex_count == ef->EdgeCount())
          candidates[candidate_count++] = ef;
      }
    }
    else
    {
      unsigned c = 0;
      for (unsigned i = 0; i < candidate_count; ++i)
      {
        if (e->FaceArrayIndex(candidates[i]) < ON_UNSET_UINT_INDEX)
          candidates[c++] = candidates[i];
      }
      candidate_count = c;
    }

    if (0 == candidate_count)
      break;
    if (1 == candidate_count)
    {
      f = candidates[0];
      break;
    }
  }

  if (nullptr != candidates && candidates != candiates4)
    onfree(candidates);

  if (nullptr == f)
    return ON_SubDFacePtr::Null;

  const unsigned fvi0 = f->VertexIndex(vertex_list[0]);
  if (fvi0 >= unsigned_vertex_count)
    return ON_SubDFacePtr::Null;

  const ON__UINT_PTR dir = (vertex_list[1] == f->Vertex((fvi0 + 1) % unsigned_vertex_count)) ? 0 : 1;
  if (0 == dir)
  {
    for (unsigned fvi = 2; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  else
  {
    for (unsigned fvi = 1; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + unsigned_vertex_count - fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  return ON_SubDFacePtr::Create(f, dir);
}